

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

UInt32 ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  uint uVar1;
  UInt32 UVar2;
  Byte *pBVar3;
  uint uVar4;
  Byte *pBVar5;
  long lVar7;
  Byte *pBVar6;
  
  UVar2 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  p->numAvail = UVar2;
  UVar2 = (*(p->matchFinder).GetMatches)(p->matchFinderObj,p->matches);
  if (UVar2 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = p->matches[UVar2 - 2];
    if (uVar4 == p->numFastBytes) {
      uVar1 = 0x111;
      if (p->numAvail < 0x111) {
        uVar1 = p->numAvail;
      }
      pBVar3 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
      pBVar5 = pBVar3 + ((ulong)uVar4 - 1);
      pBVar6 = pBVar5;
      if (uVar4 != uVar1) {
        lVar7 = (ulong)uVar1 - (ulong)uVar4;
        do {
          pBVar6 = pBVar5;
          if (*pBVar5 != pBVar5[-1 - (ulong)p->matches[UVar2 - 1]]) break;
          pBVar5 = pBVar5 + 1;
          lVar7 = lVar7 + -1;
          pBVar6 = pBVar3 + ((ulong)uVar1 - 1);
        } while (lVar7 != 0);
      }
      uVar4 = (int)pBVar6 - ((int)pBVar3 + -1);
    }
  }
  p->additionalOffset = p->additionalOffset + 1;
  *numDistancePairsRes = UVar2;
  return uVar4;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc *p, UInt32 *numDistancePairsRes)
{
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
  
  #ifdef SHOW_STAT
  printf("\n i = %u numPairs = %u    ", g_STAT_OFFSET, numPairs / 2);
  g_STAT_OFFSET++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2u %6u   | ", p->matches[i], p->matches[i + 1]);
  }
  #endif
  
  if (numPairs > 0)
  {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes)
    {
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte *pbyCur = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
        const Byte *pby = pbyCur + lenRes;
        ptrdiff_t dif = (ptrdiff_t)-1 - p->matches[numPairs - 1];
        const Byte *pbyLim = pbyCur + numAvail;
        for (; pby != pbyLim && *pby == pby[dif]; pby++);
        lenRes = (UInt32)(pby - pbyCur);
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}